

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void emit_eobrun(huff_entropy_ptr entropy)

{
  int iVar1;
  long in_RDI;
  huff_entropy_ptr unaff_retaddr;
  int nbits;
  int temp;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int iVar2;
  
  if (*(int *)(in_RDI + 0xe4) != 0) {
    iVar1 = *(int *)(in_RDI + 0xe4);
    iVar2 = 0;
    while (iVar1 = iVar1 >> 1, iVar1 != 0) {
      iVar2 = iVar2 + 1;
    }
    if (0xe < iVar2) {
      *(undefined4 *)(**(long **)(in_RDI + 0xd8) + 0x28) = 0x29;
      (**(code **)**(undefined8 **)(in_RDI + 0xd8))(*(undefined8 *)(in_RDI + 0xd8));
    }
    emit_ac_symbol((huff_entropy_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffec,
                   in_stack_ffffffffffffffe8);
    if (iVar2 != 0) {
      emit_bits_e(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    *(undefined4 *)(in_RDI + 0xe4) = 0;
    emit_buffered_bits((huff_entropy_ptr)CONCAT44(iVar1,iVar2),
                       (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
    *(undefined4 *)(in_RDI + 0xe8) = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_eobrun (huff_entropy_ptr entropy)
{
  register int temp, nbits;

  if (entropy->EOBRUN > 0) {	/* if there is any pending EOBRUN */
    temp = entropy->EOBRUN;
    nbits = 0;
    while ((temp >>= 1))
      nbits++;
    /* safety check: shouldn't happen given limited correction-bit buffer */
    if (nbits > 14)
      ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

    emit_ac_symbol(entropy, entropy->ac_tbl_no, nbits << 4);
    if (nbits)
      emit_bits_e(entropy, entropy->EOBRUN, nbits);

    entropy->EOBRUN = 0;

    /* Emit any buffered correction bits */
    emit_buffered_bits(entropy, entropy->bit_buffer, entropy->BE);
    entropy->BE = 0;
  }
}